

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O1

AllocationCallbackRecord *
vk::AllocationCallbackRecord::allocation
          (AllocationCallbackRecord *__return_storage_ptr__,size_t size,size_t alignment,
          VkSystemAllocationScope scope,void *returnedPtr)

{
  __return_storage_ptr__->type = TYPE_ALLOCATION;
  (__return_storage_ptr__->data).allocation.size = size;
  (__return_storage_ptr__->data).allocation.alignment = alignment;
  (__return_storage_ptr__->data).allocation.scope = scope;
  (__return_storage_ptr__->data).allocation.returnedPtr = returnedPtr;
  return __return_storage_ptr__;
}

Assistant:

AllocationCallbackRecord AllocationCallbackRecord::allocation (size_t size, size_t alignment, VkSystemAllocationScope scope, void* returnedPtr)
{
	AllocationCallbackRecord record;

	record.type							= TYPE_ALLOCATION;
	record.data.allocation.size			= size;
	record.data.allocation.alignment	= alignment;
	record.data.allocation.scope		= scope;
	record.data.allocation.returnedPtr	= returnedPtr;

	return record;
}